

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O1

uintptr_t websocket_subscribe(websocket_subscribe_s args)

{
  char cVar1;
  subscribe_args_s args_00;
  int iVar2;
  intptr_t *piVar3;
  subscription_s *psVar4;
  long *plVar5;
  int *piVar6;
  long lVar7;
  undefined8 unaff_RBX;
  code *pcVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  char *format;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  code *pcVar11;
  undefined8 unaff_R14;
  intptr_t type;
  undefined8 unaff_R15;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  undefined8 unaff_retaddr;
  long in_stack_00000008;
  undefined8 in_stack_00000010;
  long in_stack_00000028;
  code *in_stack_00000030;
  intptr_t in_stack_00000038;
  byte in_stack_00000048;
  fio_lock_i ret;
  undefined8 auStackY_d8 [10];
  timespec local_88;
  undefined4 local_70 [10];
  code *local_48;
  code *local_40;
  undefined8 local_38;
  
  bVar14 = 0;
  if ((in_stack_00000008 == 0) ||
     (iVar2 = fio_is_valid(*(intptr_t *)(in_stack_00000008 + 0x30)), iVar2 == 0)) {
    if (in_stack_00000030 != (code *)0x0) {
      (*in_stack_00000030)(in_stack_00000038);
    }
    return 0;
  }
  piVar3 = (intptr_t *)malloc(0x18);
  if (piVar3 == (intptr_t *)0x0) {
    if (FIO_LOG_LEVEL < 1) goto LAB_0015c586;
    format = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/websockets.c:635"
    ;
  }
  else {
    *piVar3 = in_stack_00000028;
    piVar3[1] = (intptr_t)in_stack_00000030;
    piVar3[2] = in_stack_00000038;
    if (in_stack_00000028 == 0) {
      bVar12 = (in_stack_00000048 & 2) == 0;
      pcVar8 = websocket_on_pubsub_message_direct_txt;
      if (bVar12) {
        pcVar8 = websocket_on_pubsub_message_direct;
      }
      bVar13 = (in_stack_00000048 & 1) == 0;
      type = -0x22;
      if (bVar13) {
        type = (ulong)bVar12 - 0x21;
      }
      pcVar11 = websocket_on_pubsub_message_direct_bin;
      if (bVar13) {
        pcVar11 = pcVar8;
      }
      websocket_optimize4broadcasts(type,1);
      *piVar3 = type;
    }
    else {
      pcVar11 = websocket_on_pubsub_message;
    }
    local_70[0] = 0;
    local_48 = pcVar11;
    local_40 = websocket_on_unsubscribe;
    local_38 = *(undefined8 *)(in_stack_00000008 + 0x30);
    puVar9 = (undefined8 *)local_70;
    puVar10 = auStackY_d8;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar10 = *puVar9;
      puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
      puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
    }
    args_00.channel.capa = unaff_RBX;
    args_00._0_8_ = piVar3;
    args_00.channel.len = unaff_R12;
    args_00.channel.data = (char *)unaff_R13;
    args_00.match = (fio_match_fn)unaff_R14;
    args_00.on_message = (_func_void_fio_msg_s_ptr *)unaff_R15;
    args_00.udata1 = (void *)in_stack_00000008;
    args_00.on_unsubscribe = (_func_void_void_ptr_void_ptr *)unaff_retaddr;
    args_00.udata2 = (void *)in_stack_00000010;
    psVar4 = fio_subscribe(args_00);
    if (psVar4 == (subscription_s *)0x0) {
      return 0;
    }
    LOCK();
    cVar1 = *(char *)(in_stack_00000008 + 0x88);
    *(char *)(in_stack_00000008 + 0x88) = '\x01';
    UNLOCK();
    local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,cVar1);
    if (cVar1 != '\0') {
      do {
        local_88.tv_sec = 0;
        local_88.tv_nsec = 1;
        nanosleep(&local_88,(timespec *)0x0);
        LOCK();
        cVar1 = *(char *)(in_stack_00000008 + 0x88);
        *(char *)(in_stack_00000008 + 0x88) = '\x01';
        UNLOCK();
        local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,cVar1);
      } while (cVar1 != '\0');
    }
    plVar5 = (long *)calloc(0x18,1);
    if (plVar5 != (long *)0x0) {
      lVar7 = *(long *)(in_stack_00000008 + 0x70);
      *plVar5 = lVar7;
      plVar5[1] = in_stack_00000008 + 0x70;
      plVar5[2] = (long)psVar4;
      *(long **)(lVar7 + 8) = plVar5;
      *(long **)(in_stack_00000008 + 0x70) = plVar5;
      LOCK();
      *(undefined1 *)(in_stack_00000008 + 0x88) = 0;
      UNLOCK();
      return (uintptr_t)plVar5;
    }
    if (FIO_LOG_LEVEL < 1) goto LAB_0015c586;
    format = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:3313"
    ;
  }
  FIO_LOG2STDERR(format);
LAB_0015c586:
  kill(0,2);
  piVar6 = __errno_location();
  exit(*piVar6);
}

Assistant:

uintptr_t websocket_subscribe(struct websocket_subscribe_s args) {
  if (!args.ws || !fio_is_valid(args.ws->fd))
    goto error;
  websocket_sub_data_s *d = malloc(sizeof(*d));
  FIO_ASSERT_ALLOC(d);
  *d = (websocket_sub_data_s){
      .udata = args.udata,
      .on_message = args.on_message,
      .on_unsubscribe = args.on_unsubscribe,
  };
  void (*handler)(fio_msg_s *) = websocket_on_pubsub_message;
  if (!args.on_message) {
    intptr_t br_type;
    if (args.force_binary) {
      br_type = WEBSOCKET_OPTIMIZE_PUBSUB_BINARY;
      handler = websocket_on_pubsub_message_direct_bin;
    } else if (args.force_text) {
      br_type = WEBSOCKET_OPTIMIZE_PUBSUB_TEXT;
      handler = websocket_on_pubsub_message_direct_txt;
    } else {
      br_type = WEBSOCKET_OPTIMIZE_PUBSUB;
      handler = websocket_on_pubsub_message_direct;
    }
    websocket_optimize4broadcasts(br_type, 1);
    d->on_message =
        (void (*)(ws_s *, fio_str_info_s, fio_str_info_s, void *))br_type;
  }
  subscription_s *sub =
      fio_subscribe(.channel = args.channel, .match = args.match,
                    .on_unsubscribe = websocket_on_unsubscribe,
                    .on_message = handler, .udata1 = (void *)args.ws->fd,
                    .udata2 = d);
  if (!sub) {
    /* don't free `d`, return (`d` freed by fio_subscribe) */
    return 0;
  }
  fio_ls_s *pos;
  fio_lock(&args.ws->sub_lock);
  pos = fio_ls_push(&args.ws->subscriptions, sub);
  fio_unlock(&args.ws->sub_lock);

  return (uintptr_t)pos;
error:
  if (args.on_unsubscribe)
    args.on_unsubscribe(args.udata);
  return 0;
}